

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::MerkleBlock::Serialize(ByteData *__return_storage_ptr__,MerkleBlock *this)

{
  bool bVar1;
  size_type value;
  reference this_00;
  undefined1 local_a0 [8];
  ByteData bits;
  Txid *txid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *__range2;
  undefined1 local_40 [8];
  Serializer obj;
  MerkleBlock *this_local;
  
  obj._32_8_ = this;
  Serializer::Serializer((Serializer *)local_40);
  Serializer::AddDirectNumber((Serializer *)local_40,(uint32_t)this->transaction_count);
  value = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::size(&this->txids_);
  Serializer::AddVariableInt((Serializer *)local_40,value);
  __end2 = ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::begin(&this->txids_);
  txid = (Txid *)::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::end
                           (&this->txids_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
                                *)&txid);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
              ::operator*(&__end2);
    Txid::GetData((ByteData *)
                  &bits.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
    Serializer::AddDirectBytes
              ((Serializer *)local_40,
               (ByteData *)
               &bits.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    ByteData::~ByteData((ByteData *)0x7573e4);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::Txid_*,_std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>_>
    ::operator++(&__end2);
  }
  BitsToBytes((ByteData *)local_a0,&this->bits_);
  Serializer::AddVariableBuffer((Serializer *)local_40,(ByteData *)local_a0);
  Serializer::Output(__return_storage_ptr__,(Serializer *)local_40);
  ByteData::~ByteData((ByteData *)0x757460);
  Serializer::~Serializer((Serializer *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData MerkleBlock::Serialize() const {
  Serializer obj;
  obj.AddDirectNumber(static_cast<uint32_t>(transaction_count));
  obj.AddVariableInt(txids_.size());
  for (const auto& txid : txids_) {
    obj.AddDirectBytes(txid.GetData());
  }
  auto bits = BitsToBytes(bits_);
  obj.AddVariableBuffer(bits);
  return obj.Output();
}